

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O2

void testExistingStreamsUTF8(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  _Alloc_hider _Var5;
  int iVar6;
  ostream *poVar7;
  int *piVar8;
  half *phVar9;
  int h;
  half *phVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RgbaOutputFile out;
  half hStack_be;
  half hStack_bc;
  half hStack_ba;
  long local_b8;
  Rgba *local_b0;
  Array2D<Imf_3_4::Rgba> p1;
  string outfn;
  Header header;
  
  iVar6 = 0x19e51d;
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "Testing reading and writing using existing streams");
  std::endl<char,std::char_traits<char>>(poVar7);
  p1._sizeX = 0xed;
  p1._sizeY = 0x77;
  p1._data = (Rgba *)operator_new__(0x37158);
  anon_unknown.dwarf_121b4f::fillPixels1(&p1,iVar6,h);
  std::operator+(&outfn,tempDir,anon_var_dwarf_120309);
  std::operator<<((ostream *)&std::cout,"writing");
  remove(outfn._M_dataplus._M_p);
  _out = 0;
  hStack_be._h = 0;
  hStack_bc._h = 0;
  hStack_ba._h = 0;
  Imf_3_4::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,NO_COMPRESSION);
  _Var5 = outfn._M_dataplus;
  iVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile(&out,_Var5._M_p,&header,WRITE_RGBA,iVar6);
  Imf_3_4::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)&out);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&out);
  Imf_3_4::Header::~Header(&header);
  std::operator<<((ostream *)&std::cout,", reading");
  _Var5 = outfn._M_dataplus;
  iVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&header,_Var5._M_p,iVar6);
  piVar8 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar6 = *piVar8;
  lVar13 = (long)piVar8[2] - (long)iVar6;
  iVar3 = piVar8[1];
  lVar14 = (long)piVar8[3] - (long)iVar3;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D((Array2D<Imf_3_4::Rgba> *)&out,lVar14 + 1,lVar13 + 1);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            ((Rgba *)&header,(ulong)(local_b0 + (-(long)iVar3 * local_b8 - (long)iVar6)),1);
  Imf_3_4::RgbaInputFile::readPixels((int)&header,piVar8[1]);
  std::operator<<((ostream *)&std::cout,", comparing");
  phVar10 = &(p1._data)->a;
  phVar9 = &local_b0->a;
  lVar11 = 0;
  do {
    if ((int)lVar14 < lVar11) {
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&out);
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      remove(outfn._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&outfn);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&p1);
      return;
    }
    lVar12 = 0;
    while (lVar12 <= (int)lVar13) {
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar12 * 4 + -3]._h * 4);
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar10[lVar12 * 4 + -3]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p2[y][x].r == p1[y][x].r",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                      ,0x470,"void testExistingStreamsUTF8(const std::string &)");
      }
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar12 * 4 + -2]._h * 4);
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar10[lVar12 * 4 + -2]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p2[y][x].g == p1[y][x].g",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                      ,0x471,"void testExistingStreamsUTF8(const std::string &)");
      }
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar12 * 4 + -1]._h * 4);
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar10[lVar12 * 4 + -1]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p2[y][x].b == p1[y][x].b",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                      ,0x472,"void testExistingStreamsUTF8(const std::string &)");
      }
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar12 * 4]._h * 4);
      lVar4 = lVar12 * 4;
      lVar12 = lVar12 + 1;
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar10[lVar4]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p2[y][x].a == p1[y][x].a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                      ,0x473,"void testExistingStreamsUTF8(const std::string &)");
      }
    }
    lVar11 = lVar11 + 1;
    phVar10 = phVar10 + p1._sizeY * 4;
    phVar9 = phVar9 + local_b8 * 4;
  } while( true );
}

Assistant:

void
testExistingStreamsUTF8 (const std::string& tempDir)
{

    cout << "Testing reading and writing using existing streams" << endl;

    const int W = 119;
    const int H = 237;
    Array2D<Rgba> p1 (H, W);

    fillPixels1 (p1, W, H);

    // per google translate, image in Japanese
    std::string   outfn = tempDir + "画像.exr";

    {
        cout << "writing";
#ifdef _WIN32
        _wremove (WidenFilename (outfn.c_str ()).c_str ());
#else
        remove (outfn.c_str ());
#endif
        Header      header (
            W,
            H,
            1,
            IMATH_NAMESPACE::V2f (0, 0),
            1,
            INCREASING_Y,
            NO_COMPRESSION);

        RgbaOutputFile out (
            outfn.c_str (),
            header,
            WRITE_RGBA);

        out.setFrameBuffer (&p1[0][0], 1, W);
        out.writePixels (H);
    }

    {
        cout << ", reading";
        RgbaInputFile in (outfn.c_str ());
        const Box2i& dw = in.dataWindow ();
        int          w  = dw.max.x - dw.min.x + 1;
        int          h  = dw.max.y - dw.min.y + 1;
        int          dx = dw.min.x;
        int          dy = dw.min.y;

        Array2D<Rgba> p2 (h, w);
        in.setFrameBuffer (&p2[-dy][-dx], 1, w);
        in.readPixels (dw.min.y, dw.max.y);

        cout << ", comparing";
        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (p2[y][x].r == p1[y][x].r);
                assert (p2[y][x].g == p1[y][x].g);
                assert (p2[y][x].b == p1[y][x].b);
                assert (p2[y][x].a == p1[y][x].a);
            }
        }
    }

    cout << endl;

#ifdef _WIN32
    _wremove (WidenFilename (outfn.c_str ()).c_str ());
#else
    remove (outfn.c_str ());
#endif
}